

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EigenDecompositionSquare.hpp
# Opt level: O2

void __thiscall
beagle::cpu::EigenDecompositionSquare<float,_1>::setEigenDecomposition
          (EigenDecompositionSquare<float,_1> *this,int eigenIndex,double *inEigenVectors,
          double *inInverseEigenVectors,double *inEigenValues)

{
  int iVar1;
  uint length;
  
  beagleMemCpy<float,double_const>
            ((this->super_EigenDecomposition<float,_1>).gEigenValues[eigenIndex],inEigenValues,
             this->kEigenValuesSize);
  iVar1 = (this->super_EigenDecomposition<float,_1>).kStateCount;
  length = iVar1 * iVar1;
  beagleMemCpy<float,double_const>(this->gEMatrices[eigenIndex],inEigenVectors,length);
  beagleMemCpy<float,double_const>(this->gIMatrices[eigenIndex],inInverseEigenVectors,length);
  if (((this->super_EigenDecomposition<float,_1>).kFlags & 0x200000) == 0) {
    return;
  }
  transposeSquareMatrix<float>
            (this->gIMatrices[eigenIndex],(this->super_EigenDecomposition<float,_1>).kStateCount);
  return;
}

Assistant:

BEAGLE_CPU_EIGEN_TEMPLATE
void EigenDecompositionSquare<BEAGLE_CPU_EIGEN_GENERIC>::setEigenDecomposition(int eigenIndex,
										             const double* inEigenVectors,
                                                     const double* inInverseEigenVectors,
                                                     const double* inEigenValues) {
    
	beagleMemCpy(gEigenValues[eigenIndex],inEigenValues,kEigenValuesSize);
	const int len = kStateCount * kStateCount;
	beagleMemCpy(gEMatrices[eigenIndex],inEigenVectors,len);
	beagleMemCpy(gIMatrices[eigenIndex],inInverseEigenVectors,len);
    if (kFlags & BEAGLE_FLAG_INVEVEC_TRANSPOSED) // TODO: optimize, might not need to transpose here
        transposeSquareMatrix(gIMatrices[eigenIndex], kStateCount);
}